

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlParseChunk(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  htmlParserCtxtPtr val;
  char *val_00;
  int local_44;
  int n_terminate;
  int terminate;
  int n_size;
  int size;
  int n_chunk;
  char *chunk;
  int n_ctxt;
  htmlParserCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (chunk._4_4_ = 0; (int)chunk._4_4_ < 3; chunk._4_4_ = chunk._4_4_ + 1) {
    for (n_size = 0; n_size < 4; n_size = n_size + 1) {
      for (n_terminate = 0; n_terminate < 4; n_terminate = n_terminate + 1) {
        for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_htmlParserCtxtPtr(chunk._4_4_,0);
          val_00 = gen_const_char_ptr(n_size,1);
          terminate = gen_int(n_terminate,2);
          iVar2 = gen_int(local_44,3);
          if (val_00 != (char *)0x0) {
            iVar3 = xmlStrlen(val_00);
            if (iVar3 < terminate) {
              terminate = 0;
            }
          }
          iVar3 = htmlParseChunk(val,val_00,terminate,iVar2);
          if (val != (htmlParserCtxtPtr)0x0) {
            xmlFreeDoc(val->myDoc);
            val->myDoc = (xmlDocPtr)0x0;
          }
          desret_int(iVar3);
          call_tests = call_tests + 1;
          des_htmlParserCtxtPtr(chunk._4_4_,val,0);
          des_const_char_ptr(n_size,val_00,1);
          des_int(n_terminate,terminate,2);
          des_int(local_44,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)chunk._4_4_);
            printf(" %d",(ulong)(uint)n_size);
            printf(" %d",(ulong)(uint)n_terminate);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_htmlParseChunk(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED) && defined(LIBXML_PUSH_ENABLED)
    int mem_base;
    int ret_val;
    htmlParserCtxtPtr ctxt; /* an HTML parser context */
    int n_ctxt;
    const char * chunk; /* chunk of memory */
    int n_chunk;
    int size; /* size of chunk in bytes */
    int n_size;
    int terminate; /* last chunk indicator */
    int n_terminate;

    for (n_ctxt = 0;n_ctxt < gen_nb_htmlParserCtxtPtr;n_ctxt++) {
    for (n_chunk = 0;n_chunk < gen_nb_const_char_ptr;n_chunk++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_terminate = 0;n_terminate < gen_nb_int;n_terminate++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_htmlParserCtxtPtr(n_ctxt, 0);
        chunk = gen_const_char_ptr(n_chunk, 1);
        size = gen_int(n_size, 2);
        terminate = gen_int(n_terminate, 3);
        if ((chunk != NULL) &&
            (size > xmlStrlen(BAD_CAST chunk)))
            size = 0;

        ret_val = htmlParseChunk(ctxt, chunk, size, terminate);
        if (ctxt != NULL) {xmlFreeDoc(ctxt->myDoc); ctxt->myDoc = NULL;}
        desret_int(ret_val);
        call_tests++;
        des_htmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_char_ptr(n_chunk, chunk, 1);
        des_int(n_size, size, 2);
        des_int(n_terminate, terminate, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlParseChunk",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_chunk);
            printf(" %d", n_size);
            printf(" %d", n_terminate);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}